

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
::Base_swap(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
            *this,Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
                  *matrixToCopy)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_unsigned_int>,_false>_>_>
  local_28;
  
  (this->indexToRow_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->indexToRow_)._M_h._M_bucket_count = (matrixToCopy->indexToRow_)._M_h._M_bucket_count;
  (this->indexToRow_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->indexToRow_)._M_h._M_element_count = (matrixToCopy->indexToRow_)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(matrixToCopy->indexToRow_)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (matrixToCopy->indexToRow_)._M_h._M_rehash_policy._M_next_resize;
  (this->indexToRow_)._M_h._M_rehash_policy._M_max_load_factor =
       (matrixToCopy->indexToRow_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->indexToRow_)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->indexToRow_)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->indexToRow_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_28._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_int>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this,(_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)matrixToCopy,&local_28);
  local_28._M_h = (__hashtable_alloc *)&this->rowToIndex_;
  (this->rowToIndex_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->rowToIndex_)._M_h._M_bucket_count = (matrixToCopy->rowToIndex_)._M_h._M_bucket_count;
  (this->rowToIndex_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rowToIndex_)._M_h._M_element_count = (matrixToCopy->rowToIndex_)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(matrixToCopy->rowToIndex_)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (matrixToCopy->rowToIndex_)._M_h._M_rehash_policy._M_next_resize;
  (this->rowToIndex_)._M_h._M_rehash_policy._M_max_load_factor =
       (matrixToCopy->rowToIndex_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->rowToIndex_)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->rowToIndex_)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->rowToIndex_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_int>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_28._M_h,&(matrixToCopy->rowToIndex_)._M_h,&local_28);
  this->rowSwapped_ = matrixToCopy->rowSwapped_;
  return;
}

Assistant:

Base_swap(const Base_swap& matrixToCopy) = default;